

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

DenseSetPair<llvm::StringRef> * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
::InsertIntoBucketImpl<llvm::StringRef>
          (DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
           *this,StringRef *Key,StringRef *Lookup,DenseSetPair<llvm::StringRef> *TheBucket)

{
  bool bVar1;
  uint uVar2;
  uint AtLeast;
  uint uVar3;
  StringRef *pSVar4;
  StringRef RHS;
  StringRef EmptyKey;
  uint NumBuckets;
  uint NewNumEntries;
  DenseSetPair<llvm::StringRef> *TheBucket_local;
  StringRef *Lookup_local;
  StringRef *Key_local;
  DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
  *this_local;
  
  _NumBuckets = TheBucket;
  TheBucket_local = (DenseSetPair<llvm::StringRef> *)Lookup;
  Lookup_local = Key;
  Key_local = (StringRef *)this;
  DebugEpochBase::incrementEpoch((DebugEpochBase *)this);
  uVar2 = getNumEntries(this);
  AtLeast = getNumBuckets(this);
  if ((uVar2 + 1) * 4 < AtLeast * 3) {
    uVar3 = getNumTombstones(this);
    if (AtLeast - (uVar2 + 1 + uVar3) <= AtLeast >> 3) {
      grow(this,AtLeast);
      LookupBucketFor<llvm::StringRef>
                (this,&TheBucket_local->key,(DenseSetPair<llvm::StringRef> **)&NumBuckets);
    }
  }
  else {
    grow(this,AtLeast << 1);
    LookupBucketFor<llvm::StringRef>
              (this,&TheBucket_local->key,(DenseSetPair<llvm::StringRef> **)&NumBuckets);
    getNumBuckets(this);
  }
  if (_NumBuckets == (DenseSetPair<llvm::StringRef> *)0x0) {
    __assert_fail("TheBucket",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                  ,0x22a,
                  "BucketT *llvm::DenseMapBase<llvm::DenseMap<llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>, llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>::InsertIntoBucketImpl(const KeyT &, const LookupKeyT &, BucketT *) [DerivedT = llvm::DenseMap<llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>, KeyT = llvm::StringRef, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<StringRef>, BucketT = llvm::detail::DenseSetPair<llvm::StringRef>, LookupKeyT = llvm::StringRef]"
                 );
  }
  incrementNumEntries(this);
  RHS = getEmptyKey();
  pSVar4 = detail::DenseSetPair<llvm::StringRef>::getFirst(_NumBuckets);
  bVar1 = DenseMapInfo<llvm::StringRef>::isEqual(*pSVar4,RHS);
  if (!bVar1) {
    decrementNumTombstones(this);
  }
  return _NumBuckets;
}

Assistant:

BucketT *InsertIntoBucketImpl(const KeyT &Key, const LookupKeyT &Lookup,
                                BucketT *TheBucket) {
    incrementEpoch();

    // If the load of the hash table is more than 3/4, or if fewer than 1/8 of
    // the buckets are empty (meaning that many are filled with tombstones),
    // grow the table.
    //
    // The later case is tricky.  For example, if we had one empty bucket with
    // tons of tombstones, failing lookups (e.g. for insertion) would have to
    // probe almost the entire table until it found the empty bucket.  If the
    // table completely filled with tombstones, no lookup would ever succeed,
    // causing infinite loops in lookup.
    unsigned NewNumEntries = getNumEntries() + 1;
    unsigned NumBuckets = getNumBuckets();
    if (LLVM_UNLIKELY(NewNumEntries * 4 >= NumBuckets * 3)) {
      this->grow(NumBuckets * 2);
      LookupBucketFor(Lookup, TheBucket);
      NumBuckets = getNumBuckets();
    } else if (LLVM_UNLIKELY(NumBuckets-(NewNumEntries+getNumTombstones()) <=
                             NumBuckets/8)) {
      this->grow(NumBuckets);
      LookupBucketFor(Lookup, TheBucket);
    }
    assert(TheBucket);

    // Only update the state after we've grown our bucket space appropriately
    // so that when growing buckets we have self-consistent entry count.
    incrementNumEntries();

    // If we are writing over a tombstone, remember this.
    const KeyT EmptyKey = getEmptyKey();
    if (!KeyInfoT::isEqual(TheBucket->getFirst(), EmptyKey))
      decrementNumTombstones();

    return TheBucket;
  }